

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::(anonymous_namespace)::GetFileNameBase_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *descriptor)

{
  size_type sVar1;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  string_view input;
  csharp *local_50;
  char *local_48;
  anon_unknown_3 *local_40;
  string_view base;
  undefined1 auStack_28 [4];
  int lastslash;
  string_view proto_file;
  FileDescriptor *descriptor_local;
  
  proto_file._M_str = (char *)this;
  _auStack_28 = FileDescriptor::name((FileDescriptor *)this);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,'/',
                     0xffffffffffffffff);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,
                     (long)((int)sVar1 + 1),0xffffffffffffffff);
  sVar3._M_str = bVar2._M_str;
  local_40 = (anon_unknown_3 *)bVar2._M_len;
  sVar3._M_len = (size_t)sVar3._M_str;
  sVar3 = anon_unknown_3::StripDotProto(local_40,sVar3);
  local_50 = (csharp *)sVar3._M_len;
  local_48 = sVar3._M_str;
  input._M_str = in_RCX;
  input._M_len = (size_t)local_48;
  UnderscoresToPascalCase_abi_cxx11_(__return_storage_ptr__,local_50,input);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileNameBase(const FileDescriptor* descriptor) {
  const absl::string_view proto_file = descriptor->name();
  int lastslash = proto_file.find_last_of('/');
  const absl::string_view base = proto_file.substr(lastslash + 1);
  return UnderscoresToPascalCase(StripDotProto(base));
}